

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

void __thiscall
Assimp::SMDImporter::ParseNodesSection(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  char *szCurrent_00;
  int iVar1;
  char *szCurrent_local;
  char **local_38;
  
  szCurrent_local = szCurrent;
  local_38 = szCurrentOut;
  while( true ) {
    szCurrent_00 = szCurrent_local;
    iVar1 = ASSIMP_strincmp(szCurrent_local,"end",3);
    if (((iVar1 == 0) && ((ulong)(byte)szCurrent_00[3] < 0x21)) &&
       ((0x100003601U >> ((ulong)(byte)szCurrent_00[3] & 0x3f) & 1) != 0)) break;
    ParseNodeInfo(this,szCurrent_00,&szCurrent_local);
  }
  szCurrent_local = szCurrent_00 + 4;
  SkipSpacesAndLineEnd(this,szCurrent_local,&szCurrent_local);
  *local_38 = szCurrent_local;
  return;
}

Assistant:

void SMDImporter::ParseNodesSection(const char* szCurrent, const char** szCurrentOut) {
    for ( ;; ) {
        // "end\n" - Ends the nodes section
        if (0 == ASSIMP_strincmp(szCurrent,"end",3) && IsSpaceOrNewLine(*(szCurrent+3))) {
            szCurrent += 4;
            break;
        }
        ParseNodeInfo(szCurrent,&szCurrent);
    }
    SkipSpacesAndLineEnd(szCurrent,&szCurrent);
    *szCurrentOut = szCurrent;
}